

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

void mxx::scatterv<char>(char *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
                        char *out,size_t recv_size,int root,comm *comm)

{
  pointer puVar1;
  long lVar2;
  ulong uVar3;
  vector<int,_std::allocator<int>_> send_counts;
  vector<int,_std::allocator<int>_> displs;
  int rank;
  MPI_Datatype local_48;
  bool local_40;
  size_t send_size;
  
  puVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (comm->m_rank == root) {
    if ((long)(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar1 >> 3 != (long)comm->m_size) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)_rank & 0xffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
             ,0x142,"scatterv",
             "root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size())");
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
      puVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  send_size = 0;
  for (; puVar1 != (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    send_size = send_size + *puVar1;
  }
  bcast<unsigned_long>(&send_size,root,comm);
  if (send_size < 0x7fffffff) {
    _rank = &PTR__datatype_0014c1f0;
    local_48 = (MPI_Datatype)&ompi_mpi_char;
    local_40 = true;
    if (comm->m_rank == root) {
      std::vector<int,_std::allocator<int>_>::vector
                (&send_counts,(long)comm->m_size,(allocator_type *)&displs);
      puVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = (long)(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
      if (0 < lVar2) {
        uVar3 = lVar2 + 1;
        lVar2 = 0;
        do {
          *(undefined4 *)
           ((long)send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar2) =
               *(undefined4 *)((long)puVar1 + lVar2 * 2);
          uVar3 = uVar3 - 1;
          lVar2 = lVar2 + 4;
        } while (1 < uVar3);
      }
      impl::get_displacements<int>(&displs,&send_counts);
      MPI_Scatterv(msgs,send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                   displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,local_48,out,recv_size & 0xffffffff,local_48,
                   root,comm->mpi_comm);
      if (displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      MPI_Scatterv(0,0,0,&ompi_mpi_datatype_null,out,recv_size & 0xffffffff,&ompi_mpi_char,root,
                   comm->mpi_comm);
    }
    datatype::~datatype((datatype *)&rank);
  }
  else {
    impl::scatterv_big<char>(msgs,sizes,out,recv_size,root,comm);
  }
  return;
}

Assistant:

void scatterv(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size()));
    // get total send size
    size_t send_size = std::accumulate(sizes.begin(), sizes.end(), static_cast<size_t>(0));
    mxx::bcast(send_size, root, comm);
    // check if we need to use the custom BIG scatterv
    if (send_size >= mxx::max_int) {
        // own scatter for large messages
        impl::scatterv_big(msgs, sizes, out, recv_size, root, comm);
    } else {
        // regular implementation using integer counts
        mxx::datatype dt = mxx::get_datatype<T>();
        int irecv_size = recv_size;
        if (comm.rank() == root) {
            std::vector<int> send_counts(comm.size());
            std::copy(sizes.begin(), sizes.end(), send_counts.begin());
            std::vector<int> displs = impl::get_displacements(send_counts);
            MPI_Scatterv(const_cast<T*>(msgs), &send_counts[0], &displs[0], dt.type(),
                         out, irecv_size, dt.type(), root, comm);
        } else {
            MPI_Scatterv(NULL, NULL, NULL, MPI_DATATYPE_NULL,
                         out, irecv_size, dt.type(), root, comm);
        }
    }
}